

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VSS.cpp
# Opt level: O1

void __thiscall
OpenMD::RNEMD::VSSMethod::doRNEMDImpl
          (VSSMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  double dVar2;
  int iVar3;
  RNEMDFluxType RVar4;
  Snapshot *pSVar5;
  StuntDouble *pSVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint i_2;
  Vector3d *pVVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  StuntDouble **ppSVar13;
  uint i;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double (*padVar18) [3];
  double (*padVar19) [3];
  undefined4 uVar20;
  double tmp_1;
  undefined4 uVar21;
  double tmp_7;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double tmp;
  double dVar26;
  Vector<double,_3U> result_20;
  Vector<double,_3U> result_19;
  Vector<double,_3U> result_25;
  double tmp_14;
  StuntDouble *sd;
  double tmp_10;
  Vector3<double> result_1;
  Vector<double,_3U> result_24;
  Vector<double,_3U> result;
  Vector3d ah;
  Vector3d bc;
  Vector<double,_3U> result_12;
  Vector3d ac;
  Vector<double,_3U> tmp_4;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> coldBin;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> hotBin;
  int selej;
  int selei;
  Vector<double,_3U> tmp_6;
  Vector3d bh;
  Vector3<double> result_31;
  Vector3<double> result_28;
  Mat3x3d Ic;
  Mat3x3d Ih;
  double local_440;
  double local_438 [4];
  double local_418 [4];
  double local_3f8 [4];
  double local_3d8;
  StuntDouble *local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8 [10];
  double local_368 [4];
  double local_348 [14];
  double local_2d8 [4];
  double local_2b8 [4];
  Vector3d local_298;
  double local_278 [4];
  double local_258 [4];
  StuntDouble **local_238;
  iterator iStack_230;
  StuntDouble **local_228;
  StuntDouble **local_218;
  iterator iStack_210;
  StuntDouble **local_208;
  uint local_1f8;
  uint local_1f4;
  int local_1f0;
  int local_1ec;
  double local_1e8 [3];
  SelectionManager *local_1d0;
  double local_1c8 [4];
  undefined1 local_1a8 [16];
  double local_198;
  double local_188 [4];
  double local_168 [4];
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8 [4];
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  double local_88;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  
  if ((this->super_RNEMD).doRNEMD_ != true) {
    return;
  }
  local_208 = (StuntDouble **)0x0;
  local_218 = (StuntDouble **)0x0;
  iStack_210._M_current = (StuntDouble **)0x0;
  local_228 = (StuntDouble **)0x0;
  local_238 = (StuntDouble **)0x0;
  iStack_230._M_current = (StuntDouble **)0x0;
  local_e8[2] = (double)OpenMD::V3Zero._16_8_;
  local_e8[0] = (double)OpenMD::V3Zero._0_8_;
  local_e8[1] = (double)OpenMD::V3Zero._8_8_;
  local_108[2] = (double)OpenMD::V3Zero._16_8_;
  local_108[0] = (double)OpenMD::V3Zero._0_8_;
  local_108[1] = (double)OpenMD::V3Zero._8_8_;
  local_38 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0.0;
  uStack_50 = 0;
  local_68 = 0.0;
  uStack_60 = 0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_128[2] = (double)OpenMD::V3Zero._16_8_;
  local_128[0] = (double)OpenMD::V3Zero._0_8_;
  local_128[1] = (double)OpenMD::V3Zero._8_8_;
  local_148[2] = (double)OpenMD::V3Zero._16_8_;
  local_148[0] = (double)OpenMD::V3Zero._0_8_;
  local_148[1] = (double)OpenMD::V3Zero._8_8_;
  local_88 = 0.0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0.0;
  uStack_a0 = 0;
  local_b8 = 0.0;
  uStack_b0 = 0;
  local_c8 = 0.0;
  dStack_c0 = 0.0;
  uVar14 = (this->super_RNEMD).rnemdFluxType_ - rnemdPx;
  if ((uVar14 < 0x12) && ((0x3f8ffU >> (uVar14 & 0x1f) & 1) != 0)) {
    local_1f4 = 0x3c0f0 >> ((byte)uVar14 & 0x1f);
    local_1f8 = 0x3f0f >> ((byte)uVar14 & 0x1f);
  }
  else {
    local_1f8 = (uint)CONCAT71((int7)((ulong)smanB >> 8),
                               (this->super_RNEMD).usePeriodicBoundaryConditions_);
    local_1f4 = local_1f8 ^ 1;
  }
  local_1d0 = smanB;
  local_3d0 = SelectionManager::beginSelected(smanA,&local_1ec);
  local_3d8 = 0.0;
  local_348[9] = 0.0;
  while (local_3d0 != (StuntDouble *)0x0) {
    pVVar9 = (Vector3d *)
             ((long)local_3d0->localIndex_ * 0x18 +
             *(long *)((long)&(local_3d0->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_));
    local_298.super_Vector<double,_3U>.data_[0] = 0.0;
    local_298.super_Vector<double,_3U>.data_[1] = 0.0;
    local_298.super_Vector<double,_3U>.data_[2] = 0.0;
    if (pVVar9 != &local_298) {
      lVar15 = 0;
      do {
        local_298.super_Vector<double,_3U>.data_[lVar15] =
             (pVVar9->super_Vector<double,_3U>).data_[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
    }
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&local_298);
    }
    dVar2 = local_3d0->mass_;
    pSVar5 = local_3d0->snapshotMan_->currentSnapshot_;
    lVar15 = *(long *)((long)&(pSVar5->atomData).velocity.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
    lVar17 = (long)local_3d0->localIndex_ * 0x18;
    local_2d8[2] = *(double *)(lVar15 + 0x10 + lVar17);
    pdVar12 = (double *)(lVar15 + lVar17);
    local_2d8[0] = *pdVar12;
    local_2d8[1] = pdVar12[1];
    lVar15 = *(long *)((long)&(pSVar5->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
    local_3b8[2] = *(double *)(lVar15 + 0x10 + lVar17);
    pdVar12 = (double *)(lVar15 + lVar17);
    local_3b8[0] = *pdVar12;
    local_3b8[1] = pdVar12[1];
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] =
           local_3b8[lVar15] -
           (this->super_RNEMD).coordinateOrigin_.super_Vector<double,_3U>.data_[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_348[0xc] = local_348[2];
    local_348[10] = local_348[0];
    local_348[0xb] = local_348[1];
    if (iStack_210._M_current == local_208) {
      std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
      _M_realloc_insert<OpenMD::StuntDouble*const&>
                ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&local_218,
                 iStack_210,&local_3d0);
    }
    else {
      *iStack_210._M_current = local_3d0;
      iStack_210._M_current = iStack_210._M_current + 1;
    }
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_2d8[lVar15] * dVar2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      local_e8[lVar15] = local_348[lVar15] + local_e8[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dVar26 = 0.0;
    lVar15 = 0;
    do {
      dVar26 = dVar26 + local_2d8[lVar15] * local_2d8[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_348[9] = local_348[9] + dVar2;
    local_3b8[0] = local_2d8[2] * local_348[0xb] - local_348[0xc] * local_2d8[1];
    local_3b8[1] = local_2d8[0] * local_348[0xc] - local_348[10] * local_2d8[2];
    local_3b8[2] = local_348[10] * local_2d8[1] - local_2d8[0] * local_348[0xb];
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_3b8[lVar15] * dVar2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      local_108[lVar15] = local_348[lVar15] + local_108[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3b8[6] = 0.0;
    local_3b8[7] = 0.0;
    local_3b8[4] = 0.0;
    local_3b8[5] = 0.0;
    local_3b8[2] = 0.0;
    local_3b8[3] = 0.0;
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[8] = 0.0;
    lVar15 = 0;
    pdVar12 = local_3b8;
    do {
      dVar22 = local_348[lVar15 + 10];
      lVar17 = 0;
      do {
        pdVar12[lVar17] = local_348[lVar17 + 10] * dVar22;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    local_348[6] = 0.0;
    local_348[7] = 0.0;
    local_348[4] = 0.0;
    local_348[5] = 0.0;
    local_348[2] = 0.0;
    local_348[3] = 0.0;
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[8] = 0.0;
    lVar15 = 0;
    pdVar12 = local_3b8;
    pdVar10 = local_348;
    do {
      lVar17 = 0;
      do {
        pdVar10[lVar17] = pdVar12[lVar17] * dVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar10 = pdVar10 + 3;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    pdVar12 = &local_78;
    lVar15 = 0;
    pdVar10 = local_348;
    do {
      lVar17 = 0;
      do {
        pdVar12[lVar17] = pdVar12[lVar17] - pdVar10[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar12 = pdVar12 + 3;
      pdVar10 = pdVar10 + 3;
    } while (lVar15 != 3);
    dVar22 = 0.0;
    lVar15 = 0;
    do {
      dVar22 = dVar22 + local_348[lVar15 + 10] * local_348[lVar15 + 10];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dVar22 = dVar22 * dVar2;
    local_78 = local_78 + dVar22;
    local_58 = local_58 + dVar22;
    local_38 = dVar22 + local_38;
    local_440 = dVar26 * dVar2 + local_3d8;
    if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) && (local_3d0->objType_ - otDAtom < 2))
    {
      lVar15 = *(long *)((long)&(local_3d0->snapshotMan_->currentSnapshot_->atomData).
                                angularMomentum.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
      local_3b8[2] = *(double *)(lVar15 + 0x10 + (long)local_3d0->localIndex_ * 0x18);
      pdVar12 = (double *)(lVar15 + (long)local_3d0->localIndex_ * 0x18);
      local_3b8[0] = *pdVar12;
      local_3b8[1] = pdVar12[1];
      (*local_3d0->_vptr_StuntDouble[5])(local_348);
      if (local_3d0->linear_ == true) {
        iVar3 = local_3d0->linearAxis_;
        uVar16 = (ulong)(((iVar3 + 1) / 3) * -3 + iVar3 + 1);
        uVar11 = (ulong)(iVar3 + ((iVar3 + 2) / 3) * -3 + 2);
        dVar2 = (local_3b8[uVar16] * local_3b8[uVar16]) / local_348[uVar16 * 4];
        dVar26 = local_3b8[uVar11] * local_3b8[uVar11];
        pdVar12 = local_348 + uVar11 * 4;
      }
      else {
        auVar23._0_8_ = local_3b8[0] * local_3b8[0];
        auVar23._8_8_ = local_3b8[1] * local_3b8[1];
        auVar24._8_4_ = SUB84(local_348[4],0);
        auVar24._0_8_ = local_348[0];
        auVar24._12_4_ = (int)((ulong)local_348[4] >> 0x20);
        auVar24 = divpd(auVar23,auVar24);
        dVar2 = auVar24._8_8_ + auVar24._0_8_;
        dVar26 = local_3b8[2] * local_3b8[2];
        pdVar12 = local_348 + 8;
      }
      local_440 = local_440 + dVar26 / *pdVar12 + dVar2;
    }
    local_3d0 = SelectionManager::nextSelected(smanA,&local_1ec);
    local_3d8 = local_440;
  }
  local_3d0 = SelectionManager::beginSelected(local_1d0,&local_1f0);
  uVar20 = 0;
  uVar21 = 0;
  local_3c0 = 0.0;
  while (uVar8 = local_1f4, uVar14 = local_1f8, local_3c8 = (double)CONCAT44(uVar21,uVar20),
        local_3d0 != (StuntDouble *)0x0) {
    pVVar9 = (Vector3d *)
             ((long)local_3d0->localIndex_ * 0x18 +
             *(long *)((long)&(local_3d0->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_));
    local_298.super_Vector<double,_3U>.data_[0] = 0.0;
    local_298.super_Vector<double,_3U>.data_[1] = 0.0;
    local_298.super_Vector<double,_3U>.data_[2] = 0.0;
    if (pVVar9 != &local_298) {
      lVar15 = 0;
      do {
        local_298.super_Vector<double,_3U>.data_[lVar15] =
             (pVVar9->super_Vector<double,_3U>).data_[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
    }
    if ((this->super_RNEMD).usePeriodicBoundaryConditions_ == true) {
      Snapshot::wrapVector((this->super_RNEMD).currentSnap_,&local_298);
    }
    dVar2 = local_3d0->mass_;
    pSVar5 = local_3d0->snapshotMan_->currentSnapshot_;
    lVar15 = *(long *)((long)&(pSVar5->atomData).velocity.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
    lVar17 = (long)local_3d0->localIndex_ * 0x18;
    local_2d8[2] = *(double *)(lVar15 + 0x10 + lVar17);
    pdVar12 = (double *)(lVar15 + lVar17);
    local_2d8[0] = *pdVar12;
    local_2d8[1] = pdVar12[1];
    lVar15 = *(long *)((long)&(pSVar5->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
    local_3b8[2] = *(double *)(lVar15 + 0x10 + lVar17);
    pdVar12 = (double *)(lVar15 + lVar17);
    local_3b8[0] = *pdVar12;
    local_3b8[1] = pdVar12[1];
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] =
           local_3b8[lVar15] -
           (this->super_RNEMD).coordinateOrigin_.super_Vector<double,_3U>.data_[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_348[0xc] = local_348[2];
    local_348[10] = local_348[0];
    local_348[0xb] = local_348[1];
    if (iStack_230._M_current == local_228) {
      std::vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>>::
      _M_realloc_insert<OpenMD::StuntDouble*const&>
                ((vector<OpenMD::StuntDouble*,std::allocator<OpenMD::StuntDouble*>> *)&local_238,
                 iStack_230,&local_3d0);
    }
    else {
      *iStack_230._M_current = local_3d0;
      iStack_230._M_current = iStack_230._M_current + 1;
    }
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_2d8[lVar15] * dVar2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      local_128[lVar15] = local_348[lVar15] + local_128[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dVar26 = 0.0;
    lVar15 = 0;
    do {
      dVar26 = dVar26 + local_2d8[lVar15] * local_2d8[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3c0 = local_3c0 + dVar2;
    local_3b8[0] = local_2d8[2] * local_348[0xb] - local_348[0xc] * local_2d8[1];
    local_3b8[1] = local_2d8[0] * local_348[0xc] - local_348[10] * local_2d8[2];
    local_3b8[2] = local_348[10] * local_2d8[1] - local_2d8[0] * local_348[0xb];
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_3b8[lVar15] * dVar2;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      local_148[lVar15] = local_348[lVar15] + local_148[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3b8[6] = 0.0;
    local_3b8[7] = 0.0;
    local_3b8[4] = 0.0;
    local_3b8[5] = 0.0;
    local_3b8[2] = 0.0;
    local_3b8[3] = 0.0;
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[8] = 0.0;
    lVar15 = 0;
    pdVar12 = local_3b8;
    do {
      dVar22 = local_348[lVar15 + 10];
      lVar17 = 0;
      do {
        pdVar12[lVar17] = local_348[lVar17 + 10] * dVar22;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    local_348[6] = 0.0;
    local_348[7] = 0.0;
    local_348[4] = 0.0;
    local_348[5] = 0.0;
    local_348[2] = 0.0;
    local_348[3] = 0.0;
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[8] = 0.0;
    lVar15 = 0;
    pdVar12 = local_3b8;
    pdVar10 = local_348;
    do {
      lVar17 = 0;
      do {
        pdVar10[lVar17] = pdVar12[lVar17] * dVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar10 = pdVar10 + 3;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    lVar15 = 0;
    pdVar12 = local_348;
    pdVar10 = &local_c8;
    do {
      lVar17 = 0;
      do {
        pdVar10[lVar17] = pdVar10[lVar17] - pdVar12[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      lVar15 = lVar15 + 1;
      pdVar10 = pdVar10 + 3;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    dVar22 = 0.0;
    lVar15 = 0;
    do {
      dVar22 = dVar22 + local_348[lVar15 + 10] * local_348[lVar15 + 10];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    dVar22 = dVar22 * dVar2;
    local_c8 = local_c8 + dVar22;
    local_a8 = local_a8 + dVar22;
    local_88 = dVar22 + local_88;
    local_440 = dVar26 * dVar2 + local_3c8;
    if (((this->super_RNEMD).rnemdFluxType_ == rnemdFullKE) && (local_3d0->objType_ - otDAtom < 2))
    {
      lVar15 = *(long *)((long)&(local_3d0->snapshotMan_->currentSnapshot_->atomData).
                                angularMomentum.
                                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_3d0->storage_);
      local_3b8[2] = *(double *)(lVar15 + 0x10 + (long)local_3d0->localIndex_ * 0x18);
      pdVar12 = (double *)(lVar15 + (long)local_3d0->localIndex_ * 0x18);
      local_3b8[0] = *pdVar12;
      local_3b8[1] = pdVar12[1];
      (*local_3d0->_vptr_StuntDouble[5])(local_348);
      if (local_3d0->linear_ == true) {
        iVar3 = local_3d0->linearAxis_;
        uVar16 = (ulong)(((iVar3 + 1) / 3) * -3 + iVar3 + 1);
        uVar11 = (ulong)(iVar3 + ((iVar3 + 2) / 3) * -3 + 2);
        dVar2 = (local_3b8[uVar16] * local_3b8[uVar16]) / local_348[uVar16 * 4];
        dVar26 = local_3b8[uVar11] * local_3b8[uVar11];
        pdVar12 = local_348 + uVar11 * 4;
      }
      else {
        auVar25._0_8_ = local_3b8[0] * local_3b8[0];
        auVar25._8_8_ = local_3b8[1] * local_3b8[1];
        auVar7._8_4_ = SUB84(local_348[4],0);
        auVar7._0_8_ = local_348[0];
        auVar7._12_4_ = (int)((ulong)local_348[4] >> 0x20);
        auVar24 = divpd(auVar25,auVar7);
        dVar2 = auVar24._8_8_ + auVar24._0_8_;
        dVar26 = local_3b8[2] * local_3b8[2];
        pdVar12 = local_348 + 8;
      }
      local_440 = local_440 + dVar26 / *pdVar12 + dVar2;
    }
    local_3d0 = SelectionManager::nextSelected(local_1d0,&local_1f0);
    uVar20 = SUB84(local_440,0);
    uVar21 = (undefined4)((ulong)local_440 >> 0x20);
  }
  local_298.super_Vector<double,_3U>.data_[0] = 0.0;
  local_298.super_Vector<double,_3U>.data_[1] = 0.0;
  local_298.super_Vector<double,_3U>.data_[2] = 0.0;
  local_2d8[2] = 0.0;
  local_2d8[0] = 0.0;
  local_2d8[1] = 0.0;
  local_348[0xc] = 0.0;
  local_348[10] = 0.0;
  local_348[0xb] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  if ((0.0 < local_348[9]) && (0.0 < local_3c0)) {
    local_3d8 = local_3d8 * 0.5;
    local_3c8 = local_3c8 * 0.5;
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_128[lVar15] / local_3c0;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_168[2] = local_348[2];
    local_168[0] = local_348[0];
    local_168[1] = local_348[1];
    pVVar9 = &(this->super_RNEMD).momentumTarget_;
    local_258[2] = (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[2];
    local_258[0] = (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[0];
    local_258[1] = (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[1];
    lVar15 = 0;
    do {
      local_258[lVar15] = -local_258[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar15 = 0;
    do {
      local_3b8[lVar15] = local_258[lVar15] / local_3c0;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar15 = 0;
    do {
      local_348[lVar15] = local_3b8[lVar15] + local_168[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_298.super_Vector<double,_3U>.data_[2] = local_348[2];
    local_298.super_Vector<double,_3U>.data_[0] = local_348[0];
    local_298.super_Vector<double,_3U>.data_[1] = local_348[1];
    local_348[2] = (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[2];
    local_348[0] = (pVVar9->super_Vector<double,_3U>).data_[0];
    local_348[1] = (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[1];
    lVar15 = 0;
    do {
      local_348[lVar15] = -local_348[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    padVar19 = (double (*) [3])local_348;
    padVar18 = (double (*) [3])&local_c8;
    SquareMatrix3<double>::inverse
              ((SquareMatrix3<double> *)padVar19,(SquareMatrix3<double> *)padVar18);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar15 = 0;
    do {
      dVar2 = local_3b8[lVar15];
      lVar17 = 0;
      do {
        dVar2 = dVar2 + (((SquareMatrix<double,_3> *)*padVar19)->super_RectMatrix<double,_3U,_3U>).
                        data_[0][lVar17] * local_148[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      local_3b8[lVar15] = dVar2;
      lVar15 = lVar15 + 1;
      padVar19 = padVar19 + 1;
    } while (lVar15 != 3);
    local_258[2] = local_3b8[2];
    local_258[0] = local_3b8[0];
    local_258[1] = local_3b8[1];
    local_2b8[0] = 0.0;
    local_2b8[1] = 0.0;
    local_2b8[2] = 0.0;
    pdVar12 = local_348;
    lVar15 = 0;
    do {
      dVar2 = local_2b8[lVar15];
      lVar17 = 0;
      do {
        dVar2 = dVar2 + pdVar12[lVar17] *
                        (this->super_RNEMD).angularMomentumTarget_.super_Vector<double,_3U>.data_
                        [lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
      local_2b8[lVar15] = dVar2;
      lVar15 = lVar15 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar15 != 3);
    local_1e8[2] = local_2b8[2];
    local_1e8[0] = local_2b8[0];
    local_1e8[1] = local_2b8[1];
    lVar15 = 0;
    do {
      local_1e8[lVar15] = -local_1e8[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3b8[0] = 0.0;
    local_3b8[1] = 0.0;
    local_3b8[2] = 0.0;
    lVar15 = 0;
    do {
      local_3b8[lVar15] = local_1e8[lVar15] + local_258[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_2d8[2] = local_3b8[2];
    local_2d8[0] = local_3b8[0];
    local_2d8[1] = local_3b8[1];
    dVar2 = local_3c8 - (this->super_RNEMD).kineticTarget_;
    if ((uVar14 & 1) != 0) {
      dVar26 = 0.0;
      lVar15 = 0;
      do {
        dVar22 = local_298.super_Vector<double,_3U>.data_[lVar15];
        dVar26 = dVar26 + dVar22 * dVar22;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      dVar2 = dVar2 + local_3c0 * -0.5 * dVar26;
    }
    if ((uVar8 & 1) != 0) {
      local_3b8[0] = 0.0;
      local_3b8[1] = 0.0;
      local_3b8[2] = 0.0;
      pdVar12 = &local_c8;
      lVar15 = 0;
      do {
        dVar26 = local_3b8[lVar15];
        lVar17 = 0;
        do {
          dVar26 = dVar26 + pdVar12[lVar17] * local_2d8[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_3b8[lVar15] = dVar26;
        lVar15 = lVar15 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar15 != 3);
      dVar26 = 0.0;
      lVar15 = 0;
      do {
        dVar26 = dVar26 + local_2d8[lVar15] * local_3b8[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      dVar2 = dVar2 + dVar26 * -0.5;
    }
    if ((uVar14 & 1) != 0) {
      dVar26 = 0.0;
      lVar15 = 0;
      do {
        dVar26 = dVar26 + local_168[lVar15] * local_168[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      local_3c8 = local_3c8 + local_3c0 * -0.5 * dVar26;
    }
    dVar26 = local_3c8;
    if ((uVar8 & 1) != 0) {
      local_3b8[0] = 0.0;
      local_3b8[1] = 0.0;
      local_3b8[2] = 0.0;
      lVar15 = 0;
      do {
        dVar26 = local_3b8[lVar15];
        lVar17 = 0;
        do {
          dVar26 = dVar26 + (((SquareMatrix<double,_3> *)*padVar18)->
                            super_RectMatrix<double,_3U,_3U>).data_[0][lVar17] * local_258[lVar17];
          lVar17 = lVar17 + 1;
        } while (lVar17 != 3);
        local_3b8[lVar15] = dVar26;
        lVar15 = lVar15 + 1;
        padVar18 = padVar18 + 1;
      } while (lVar15 != 3);
      dVar26 = 0.0;
      lVar15 = 0;
      do {
        dVar26 = dVar26 + local_258[lVar15] * local_3b8[lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      dVar26 = local_3c8 + dVar26 * -0.5;
    }
    dVar2 = dVar2 / dVar26;
    if (0.0 < dVar2) {
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      if ((0.9 < dVar2) && (dVar2 < 1.1)) {
        local_3b8[0] = 0.0;
        local_3b8[1] = 0.0;
        local_3b8[2] = 0.0;
        lVar15 = 0;
        do {
          local_3b8[lVar15] = local_e8[lVar15] / local_348[9];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        local_1e8[2] = local_3b8[2];
        local_1e8[0] = local_3b8[0];
        local_1e8[1] = local_3b8[1];
        local_2b8[0] = 0.0;
        local_2b8[1] = 0.0;
        local_2b8[2] = 0.0;
        lVar15 = 0;
        do {
          local_2b8[lVar15] = (pVVar9->super_Vector<double,_3U>).data_[lVar15] / local_348[9];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        local_3b8[0] = 0.0;
        local_3b8[1] = 0.0;
        local_3b8[2] = 0.0;
        lVar15 = 0;
        do {
          local_3b8[lVar15] = local_2b8[lVar15] + local_1e8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        padVar19 = (double (*) [3])local_3b8;
        local_348[0xc] = local_3b8[2];
        local_348[10] = local_3b8[0];
        local_348[0xb] = local_3b8[1];
        padVar18 = (double (*) [3])&local_78;
        SquareMatrix3<double>::inverse
                  ((SquareMatrix3<double> *)padVar19,(SquareMatrix3<double> *)padVar18);
        local_418[0] = 0.0;
        local_418[1] = 0.0;
        local_418[2] = 0.0;
        lVar15 = 0;
        do {
          dVar26 = local_418[lVar15];
          lVar17 = 0;
          do {
            dVar26 = dVar26 + (((SquareMatrix<double,_3> *)*padVar19)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][lVar17] * local_108[lVar17]
            ;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_418[lVar15] = dVar26;
          lVar15 = lVar15 + 1;
          padVar19 = padVar19 + 1;
        } while (lVar15 != 3);
        local_2b8[2] = local_418[2];
        local_2b8[0] = local_418[0];
        local_2b8[1] = local_418[1];
        local_438[0] = 0.0;
        local_438[1] = 0.0;
        local_438[2] = 0.0;
        pdVar12 = local_3b8;
        lVar15 = 0;
        do {
          dVar26 = local_438[lVar15];
          lVar17 = 0;
          do {
            dVar26 = dVar26 + pdVar12[lVar17] *
                              (this->super_RNEMD).angularMomentumTarget_.super_Vector<double,_3U>.
                              data_[lVar17];
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          local_438[lVar15] = dVar26;
          lVar15 = lVar15 + 1;
          pdVar12 = pdVar12 + 3;
        } while (lVar15 != 3);
        local_418[0] = 0.0;
        local_418[1] = 0.0;
        local_418[2] = 0.0;
        lVar15 = 0;
        do {
          local_418[lVar15] = local_438[lVar15] + local_2b8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        local_1c8[2] = local_418[2];
        local_1c8[0] = local_418[0];
        local_1c8[1] = local_418[1];
        dVar26 = (this->super_RNEMD).kineticTarget_ + local_3d8;
        if ((uVar14 & 1) != 0) {
          dVar22 = 0.0;
          lVar15 = 0;
          do {
            dVar22 = dVar22 + local_348[lVar15 + 10] * local_348[lVar15 + 10];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          dVar26 = dVar26 + local_348[9] * -0.5 * dVar22;
        }
        if ((uVar8 & 1) != 0) {
          local_418[0] = 0.0;
          local_418[1] = 0.0;
          local_418[2] = 0.0;
          pdVar12 = &local_78;
          lVar15 = 0;
          do {
            dVar22 = local_418[lVar15];
            lVar17 = 0;
            do {
              dVar22 = dVar22 + pdVar12[lVar17] * local_1c8[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            local_418[lVar15] = dVar22;
            lVar15 = lVar15 + 1;
            pdVar12 = pdVar12 + 3;
          } while (lVar15 != 3);
          dVar22 = 0.0;
          lVar15 = 0;
          do {
            dVar22 = dVar22 + local_1c8[lVar15] * local_418[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          dVar26 = dVar26 + dVar22 * -0.5;
        }
        if ((uVar14 & 1) != 0) {
          dVar22 = 0.0;
          lVar15 = 0;
          do {
            dVar22 = dVar22 + local_1e8[lVar15] * local_1e8[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_3d8 = local_3d8 + local_348[9] * -0.5 * dVar22;
        }
        dVar22 = local_3d8;
        if ((uVar8 & 1) != 0) {
          local_418[0] = 0.0;
          local_418[1] = 0.0;
          local_418[2] = 0.0;
          lVar15 = 0;
          do {
            dVar22 = local_418[lVar15];
            lVar17 = 0;
            do {
              dVar22 = dVar22 + (((SquareMatrix<double,_3> *)*padVar18)->
                                super_RectMatrix<double,_3U,_3U>).data_[0][lVar17] *
                                local_2b8[lVar17];
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            local_418[lVar15] = dVar22;
            lVar15 = lVar15 + 1;
            padVar18 = padVar18 + 1;
          } while (lVar15 != 3);
          dVar22 = 0.0;
          lVar15 = 0;
          do {
            dVar22 = dVar22 + local_2b8[lVar15] * local_418[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          dVar22 = local_3d8 + dVar22 * -0.5;
        }
        dVar26 = dVar26 / dVar22;
        if (0.0 < dVar26) {
          if (dVar26 < 0.0) {
            dVar26 = sqrt(dVar26);
          }
          else {
            dVar26 = SQRT(dVar26);
          }
          if ((0.9 < dVar26) && (dVar26 < 1.1)) {
            local_418[0] = 0.0;
            local_418[1] = 0.0;
            local_418[2] = 0.0;
            if (local_238 != iStack_230._M_current) {
              RVar4 = (this->super_RNEMD).rnemdFluxType_;
              ppSVar13 = local_238;
              do {
                if ((uVar14 & 1) != 0) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            velocity.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_278[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_278[0] = *pdVar12;
                  local_278[1] = pdVar12[1];
                  local_368[0] = 0.0;
                  local_368[1] = 0.0;
                  local_368[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_368[lVar15] = local_278[lVar15] - local_168[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar2;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] =
                         local_3f8[lVar15] + local_298.super_Vector<double,_3U>.data_[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_418[2] = local_438[2];
                  local_418[0] = local_438[0];
                  local_418[1] = local_438[1];
                }
                if ((uVar8 & 1) != 0) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            position.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_3f8[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_3f8[0] = *pdVar12;
                  local_3f8[1] = pdVar12[1];
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] =
                         local_3f8[lVar15] -
                         (this->super_RNEMD).coordinateOrigin_.super_Vector<double,_3U>.data_
                         [lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            velocity.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_278[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_278[0] = *pdVar12;
                  local_278[1] = pdVar12[1];
                  local_188[0] = local_258[1] * local_438[2] + local_438[1] * -local_258[2];
                  local_188[1] = local_258[2] * local_438[0] + local_438[2] * -local_258[0];
                  local_188[2] = local_258[0] * local_438[1] + local_438[0] * -local_258[1];
                  local_368[0] = 0.0;
                  local_368[1] = 0.0;
                  local_368[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_368[lVar15] = local_278[lVar15] - local_188[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar2;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  dVar22 = local_438[0] * local_2d8[2] + local_438[2] * -local_2d8[0];
                  local_1a8._8_4_ = SUB84(dVar22,0);
                  local_1a8._0_8_ = local_438[2] * local_2d8[1] + local_438[1] * -local_2d8[2];
                  local_1a8._12_4_ = (int)((ulong)dVar22 >> 0x20);
                  local_198 = local_2d8[0] * local_438[1] + local_438[0] * -local_2d8[1];
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] = local_3f8[lVar15] + *(double *)(local_1a8 + lVar15 * 8);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_418[2] = local_438[2];
                  local_418[0] = local_438[0];
                  local_418[1] = local_438[1];
                }
                pSVar6 = *ppSVar13;
                iVar3 = pSVar6->localIndex_;
                lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                          velocity.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar6->storage_);
                *(double *)(lVar15 + 0x10 + (long)iVar3 * 0x18) = local_418[2];
                pdVar12 = (double *)(lVar15 + (long)iVar3 * 0x18);
                *pdVar12 = local_418[0];
                pdVar12[1] = local_418[1];
                if ((RVar4 == rnemdFullKE) && (pSVar6->objType_ - otDAtom < 2)) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            angularMomentum.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_368[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_368[0] = *pdVar12;
                  local_368[1] = pdVar12[1];
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar2;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_438[2] = local_3f8[2];
                  local_438[0] = local_3f8[0];
                  local_438[1] = local_3f8[1];
                  pSVar6 = *ppSVar13;
                  iVar3 = pSVar6->localIndex_;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            angularMomentum.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  *(double *)(lVar15 + 0x10 + (long)iVar3 * 0x18) = local_3f8[2];
                  pdVar12 = (double *)(lVar15 + (long)iVar3 * 0x18);
                  *pdVar12 = local_3f8[0];
                  pdVar12[1] = local_3f8[1];
                }
                ppSVar13 = ppSVar13 + 1;
              } while (ppSVar13 != iStack_230._M_current);
            }
            if (local_218 != iStack_210._M_current) {
              RVar4 = (this->super_RNEMD).rnemdFluxType_;
              ppSVar13 = local_218;
              do {
                if ((uVar14 & 1) != 0) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            velocity.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_278[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_278[0] = *pdVar12;
                  local_278[1] = pdVar12[1];
                  local_368[0] = 0.0;
                  local_368[1] = 0.0;
                  local_368[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_368[lVar15] = local_278[lVar15] - local_1e8[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar26;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] = local_3f8[lVar15] + local_348[lVar15 + 10];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_418[2] = local_438[2];
                  local_418[0] = local_438[0];
                  local_418[1] = local_438[1];
                }
                if ((uVar8 & 1) != 0) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            position.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_3f8[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_3f8[0] = *pdVar12;
                  local_3f8[1] = pdVar12[1];
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] =
                         local_3f8[lVar15] -
                         (this->super_RNEMD).coordinateOrigin_.super_Vector<double,_3U>.data_
                         [lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            velocity.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_278[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_278[0] = *pdVar12;
                  local_278[1] = pdVar12[1];
                  local_188[0] = local_2b8[1] * local_438[2] + local_438[1] * -local_2b8[2];
                  local_188[1] = local_2b8[2] * local_438[0] + local_438[2] * -local_2b8[0];
                  local_188[2] = local_2b8[0] * local_438[1] + local_438[0] * -local_2b8[1];
                  local_368[0] = 0.0;
                  local_368[1] = 0.0;
                  local_368[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_368[lVar15] = local_278[lVar15] - local_188[lVar15];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar26;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  dVar2 = local_438[0] * local_1c8[2] + local_438[2] * -local_1c8[0];
                  local_1a8._8_4_ = SUB84(dVar2,0);
                  local_1a8._0_8_ = local_438[2] * local_1c8[1] + local_438[1] * -local_1c8[2];
                  local_1a8._12_4_ = (int)((ulong)dVar2 >> 0x20);
                  local_198 = local_1c8[0] * local_438[1] + local_438[0] * -local_1c8[1];
                  local_438[0] = 0.0;
                  local_438[1] = 0.0;
                  local_438[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_438[lVar15] = local_3f8[lVar15] + *(double *)(local_1a8 + lVar15 * 8);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_418[2] = local_438[2];
                  local_418[0] = local_438[0];
                  local_418[1] = local_438[1];
                }
                pSVar6 = *ppSVar13;
                iVar3 = pSVar6->localIndex_;
                lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                          velocity.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar6->storage_);
                *(double *)(lVar15 + 0x10 + (long)iVar3 * 0x18) = local_418[2];
                pdVar12 = (double *)(lVar15 + (long)iVar3 * 0x18);
                *pdVar12 = local_418[0];
                pdVar12[1] = local_418[1];
                if ((RVar4 == rnemdFullKE) && (pSVar6->objType_ - otDAtom < 2)) {
                  pSVar6 = *ppSVar13;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            angularMomentum.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  local_368[2] = (double)*(undefined8 *)
                                          (lVar15 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
                  pdVar12 = (double *)(lVar15 + (long)pSVar6->localIndex_ * 0x18);
                  local_368[0] = *pdVar12;
                  local_368[1] = pdVar12[1];
                  local_3f8[0] = 0.0;
                  local_3f8[1] = 0.0;
                  local_3f8[2] = 0.0;
                  lVar15 = 0;
                  do {
                    local_3f8[lVar15] = local_368[lVar15] * dVar26;
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_438[2] = local_3f8[2];
                  local_438[0] = local_3f8[0];
                  local_438[1] = local_3f8[1];
                  pSVar6 = *ppSVar13;
                  iVar3 = pSVar6->localIndex_;
                  lVar15 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).
                                            angularMomentum.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    pSVar6->storage_);
                  *(double *)(lVar15 + 0x10 + (long)iVar3 * 0x18) = local_3f8[2];
                  pdVar12 = (double *)(lVar15 + (long)iVar3 * 0x18);
                  *pdVar12 = local_3f8[0];
                  pdVar12[1] = local_3f8[1];
                }
                ppSVar13 = ppSVar13 + 1;
              } while (ppSVar13 != iStack_210._M_current);
            }
            (this->super_RNEMD).kineticExchange_ =
                 (this->super_RNEMD).kineticTarget_ + (this->super_RNEMD).kineticExchange_;
            lVar15 = 0;
            do {
              (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[lVar15] =
                   (this->super_RNEMD).momentumTarget_.super_Vector<double,_3U>.data_[lVar15] +
                   (this->super_RNEMD).momentumExchange_.super_Vector<double,_3U>.data_[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            lVar15 = 0;
            do {
              (this->super_RNEMD).angularMomentumExchange_.super_Vector<double,_3U>.data_[lVar15] =
                   (this->super_RNEMD).angularMomentumTarget_.super_Vector<double,_3U>.data_[lVar15]
                   + (this->super_RNEMD).angularMomentumExchange_.super_Vector<double,_3U>.data_
                     [lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 3);
            goto LAB_00286182;
          }
        }
      }
    }
  }
  memcpy(&painCave,
         "VSS exchange NOT performed - roots that solve\n\tthe constraint equations may not exist or there may be\n\tno selected objects in one or both slabs.\n"
         ,0x92);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  puVar1 = &(this->super_RNEMD).failTrialCount_;
  *puVar1 = *puVar1 + 1;
LAB_00286182:
  if (local_238 != (StuntDouble **)0x0) {
    operator_delete(local_238,(long)local_228 - (long)local_238);
  }
  if (local_218 != (StuntDouble **)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  return;
}

Assistant:

void VSSMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;
    int selei;
    int selej;

    StuntDouble* sd;

    vector<StuntDouble*> hotBin, coldBin;

    Vector3d Ph(V3Zero);
    Vector3d Lh(V3Zero);
    RealType Mh = 0.0;
    Mat3x3d Ih(0.0);
    RealType Kh = 0.0;
    Vector3d Pc(V3Zero);
    Vector3d Lc(V3Zero);
    RealType Mc = 0.0;
    Mat3x3d Ic(0.0);
    RealType Kc = 0.0;

    // Constraints can be on only the linear or angular momentum, but
    // not both.  Usually, the user will specify which they want, but
    // in case they don't, the use of periodic boundaries should make
    // the choice for us.
    bool doLinearPart  = false;
    bool doAngularPart = false;

    switch (rnemdFluxType_) {
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
    case rnemdPvector:
    case rnemdKePx:
    case rnemdKePy:
    case rnemdKePvector:
      doLinearPart = true;
      break;
    case rnemdLx:
    case rnemdLy:
    case rnemdLz:
    case rnemdLvector:
    case rnemdKeLx:
    case rnemdKeLy:
    case rnemdKeLz:
    case rnemdKeLvector:
      doAngularPart = true;
      break;
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
    default:
      if (usePeriodicBoundaryConditions_)
        doLinearPart = true;
      else
        doAngularPart = true;
      break;
    }

    for (sd = smanA.beginSelected(selei); sd != NULL;
         sd = smanA.nextSelected(selei)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      hotBin.push_back(sd);
      Ph += mass * vel;
      Mh += mass;
      Kh += mass * vel.lengthSquare();
      Lh += mass * cross(rPos, vel);
      Ih -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ih(0, 0) += mass * r2;
      Ih(1, 1) += mass * r2;
      Ih(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kh += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kh += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    for (sd = smanB.beginSelected(selej); sd != NULL;
         sd = smanB.nextSelected(selej)) {
      Vector3d pos = sd->getPos();

      // wrap the stuntdouble's position back into the box:
      if (usePeriodicBoundaryConditions_) currentSnap_->wrapVector(pos);

      RealType mass = sd->getMass();
      Vector3d vel  = sd->getVel();
      Vector3d rPos = sd->getPos() - coordinateOrigin_;
      RealType r2;

      coldBin.push_back(sd);
      Pc += mass * vel;
      Mc += mass;
      Kc += mass * vel.lengthSquare();
      Lc += mass * cross(rPos, vel);
      Ic -= outProduct(rPos, rPos) * mass;
      r2 = rPos.lengthSquare();
      Ic(0, 0) += mass * r2;
      Ic(1, 1) += mass * r2;
      Ic(2, 2) += mass * r2;

      if (rnemdFluxType_ == rnemdFullKE) {
        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ();
          Mat3x3d I       = sd->getI();
          if (sd->isLinear()) {
            int i = sd->linearAxis();
            int j = (i + 1) % 3;
            int k = (i + 2) % 3;
            Kc += angMom[j] * angMom[j] / I(j, j) +
                  angMom[k] * angMom[k] / I(k, k);
          } else {
            Kc += angMom[0] * angMom[0] / I(0, 0) +
                  angMom[1] * angMom[1] / I(1, 1) +
                  angMom[2] * angMom[2] / I(2, 2);
          }
        }
      }
    }

    Kh *= 0.5;
    Kc *= 0.5;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &Ph[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Pc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lh[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Lc[0], 3, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kh, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Mc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &Kc, 1, MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ih.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, Ic.getArrayPointer(), 9, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    Vector3d ac, acrec, bc, bcrec;
    Vector3d ah, ahrec, bh, bhrec;

    bool successfulExchange = false;
    if ((Mh > 0.0) && (Mc > 0.0)) {  // both slabs are not empty

      Vector3d vc = Pc / Mc;
      ac          = -momentumTarget_ / Mc + vc;
      acrec       = -momentumTarget_ / Mc;

      // We now need the inverse of the inertia tensor to calculate the
      // angular velocity of the cold slab;
      Mat3x3d Ici     = Ic.inverse();
      Vector3d omegac = Ici * Lc;
      bc              = -(Ici * angularMomentumTarget_) + omegac;
      bcrec           = bc - omegac;

      RealType cNumerator = Kc - kineticTarget_;
      if (doLinearPart) cNumerator -= 0.5 * Mc * ac.lengthSquare();

      if (doAngularPart) cNumerator -= 0.5 * (dot(bc, Ic * bc));

      RealType cDenominator = Kc;

      if (doLinearPart) cDenominator -= 0.5 * Mc * vc.lengthSquare();

      if (doAngularPart) cDenominator -= 0.5 * (dot(omegac, Ic * omegac));

      if (cNumerator / cDenominator > 0.0) {
        RealType c = sqrt(cNumerator / cDenominator);

        if ((c > 0.9) && (c < 1.1)) {  // restrict scaling coefficients

          Vector3d vh = Ph / Mh;
          ah          = momentumTarget_ / Mh + vh;
          ahrec       = momentumTarget_ / Mh;

          // We now need the inverse of the inertia tensor to
          // calculate the angular velocity of the hot slab;
          Mat3x3d Ihi     = Ih.inverse();
          Vector3d omegah = Ihi * Lh;
          bh              = (Ihi * angularMomentumTarget_) + omegah;
          bhrec           = bh - omegah;

          RealType hNumerator = Kh + kineticTarget_;
          if (doLinearPart) hNumerator -= 0.5 * Mh * ah.lengthSquare();

          if (doAngularPart) hNumerator -= 0.5 * (dot(bh, Ih * bh));

          RealType hDenominator = Kh;
          if (doLinearPart) hDenominator -= 0.5 * Mh * vh.lengthSquare();
          if (doAngularPart) hDenominator -= 0.5 * (dot(omegah, Ih * omegah));

          if (hNumerator / hDenominator > 0.0) {
            RealType h = sqrt(hNumerator / hDenominator);

            if ((h > 0.9) && (h < 1.1)) {
              vector<StuntDouble*>::iterator sdi;
              Vector3d vel;
              Vector3d rPos;

              for (sdi = coldBin.begin(); sdi != coldBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vc) * c + ac;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegac, rPos)) * c +
                        cross(bc, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * c;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              for (sdi = hotBin.begin(); sdi != hotBin.end(); ++sdi) {
                if (doLinearPart) vel = ((*sdi)->getVel() - vh) * h + ah;
                if (doAngularPart) {
                  rPos = (*sdi)->getPos() - coordinateOrigin_;
                  vel  = ((*sdi)->getVel() - cross(omegah, rPos)) * h +
                        cross(bh, rPos);
                }

                (*sdi)->setVel(vel);

                if (rnemdFluxType_ == rnemdFullKE) {
                  if ((*sdi)->isDirectional()) {
                    Vector3d angMom = (*sdi)->getJ() * h;
                    (*sdi)->setJ(angMom);
                  }
                }
              }

              successfulExchange = true;
              kineticExchange_ += kineticTarget_;
              momentumExchange_ += momentumTarget_;
              angularMomentumExchange_ += angularMomentumTarget_;
            }
          }
        }
      }
    }

    if (successfulExchange != true) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "VSS exchange NOT performed - roots that solve\n"
               "\tthe constraint equations may not exist or there may be\n"
               "\tno selected objects in one or both slabs.\n");
      painCave.isFatal  = 0;
      painCave.severity = OPENMD_INFO;
      simError();
      failTrialCount_++;
    }
  }